

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

json_t * json_copy(json_t *json)

{
  void *iter;
  char *key;
  ulong uVar1;
  json_t *pjVar2;
  json_t *pjVar3;
  ulong index;
  
  if (json != (json_t *)0x0) {
    switch(json->type) {
    case JSON_OBJECT:
      pjVar3 = json_object();
      if (pjVar3 != (json_t *)0x0) {
        iter = json_object_iter(json);
        while( true ) {
          key = json_object_iter_key(iter);
          if (key == (char *)0x0) {
            return pjVar3;
          }
          pjVar2 = (json_t *)hashtable_iter_value(key + -0x28);
          if (pjVar2 == (json_t *)0x0) break;
          json_object_set_new_nocheck(pjVar3,key,pjVar2);
          iter = json_object_iter_next(json,key + -0x28);
        }
        return pjVar3;
      }
      break;
    case JSON_ARRAY:
      pjVar3 = json_array();
      if (pjVar3 != (json_t *)0x0) {
        index = 0;
        while( true ) {
          if (json->type == JSON_ARRAY) {
            uVar1 = *(ulong *)(json + 4);
          }
          else {
            uVar1 = 0;
          }
          if (uVar1 <= index) break;
          pjVar2 = json_array_get(json,index);
          json_array_append_new(pjVar3,pjVar2);
          index = index + 1;
        }
        return pjVar3;
      }
      break;
    case JSON_STRING:
      pjVar3 = json_string_copy(json);
      return pjVar3;
    case JSON_INTEGER:
      pjVar3 = json_integer_copy(json);
      return pjVar3;
    case JSON_REAL:
      pjVar3 = json_real_copy(json);
      return pjVar3;
    case JSON_TRUE:
    case JSON_FALSE:
    case JSON_NULL:
      goto switchD_00114ce0_caseD_5;
    }
  }
  json = (json_t *)0x0;
switchD_00114ce0_caseD_5:
  return json;
}

Assistant:

json_t *json_copy(json_t *json) {
    if (!json)
        return NULL;

    switch (json_typeof(json)) {
        case JSON_OBJECT:
            return json_object_copy(json);
        case JSON_ARRAY:
            return json_array_copy(json);
        case JSON_STRING:
            return json_string_copy(json);
        case JSON_INTEGER:
            return json_integer_copy(json);
        case JSON_REAL:
            return json_real_copy(json);
        case JSON_TRUE:
        case JSON_FALSE:
        case JSON_NULL:
            return json;
        default:
            return NULL;
    }
}